

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
spvtools::val::ValidationState_t::EntryPointReferences
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t func_00;
  reference ppIVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  const_iterator __first;
  const_iterator __last;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_01;
  reference ppVar3;
  Instruction *local_b0;
  Instruction *next_inst;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> pair;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range4;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> function_entry_points;
  Function *func;
  value_type current_inst;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  stack;
  Instruction *local_28;
  Instruction *inst;
  ValidationState_t *pVStack_18;
  uint32_t id_local;
  ValidationState_t *this_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *referenced_entry_points
  ;
  
  inst._3_1_ = 0;
  inst._4_4_ = id;
  pVStack_18 = this;
  this_local = (ValidationState_t *)__return_storage_ptr__;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (__return_storage_ptr__);
  local_28 = FindDef(this,inst._4_4_);
  if (local_28 == (Instruction *)0x0) {
    inst._3_1_ = 1;
    stack.
    super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::
    vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
              *)&current_inst);
    std::
    vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 *)&current_inst,&local_28);
    while (bVar1 = std::
                   vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                   ::empty((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                            *)&current_inst), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar2 = std::
                vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                ::back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                        *)&current_inst);
      this_00 = *ppIVar2;
      std::
      vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
      ::pop_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                  *)&current_inst);
      function_entry_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &Instruction::function(this_00)->id_;
      if ((Function *)
          function_entry_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage == (Function *)0x0) {
        this_01 = Instruction::uses(this_00);
        __end4 = std::
                 vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ::begin(this_01);
        pair._8_8_ = std::
                     vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                     ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                           *)&pair.second), bVar1) {
          ppVar3 = __gnu_cxx::
                   __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                   ::operator*(&__end4);
          local_b0 = ppVar3->first;
          pair.first = *(Instruction **)&ppVar3->second;
          next_inst = local_b0;
          std::
          vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
          ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                       *)&current_inst,&local_b0);
          __gnu_cxx::
          __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
          ::operator++(&__end4);
        }
      }
      else {
        func_00 = Function::id((Function *)
                               function_entry_points.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        __x = FunctionEntryPoints(this,func_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,__x);
        __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                   __return_storage_ptr__,
                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first._M_current,
                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      }
    }
    inst._3_1_ = 1;
    stack.
    super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::
    vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::~vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
               *)&current_inst);
  }
  if ((inst._3_1_ & 1) == 0) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint32_t> ValidationState_t::EntryPointReferences(uint32_t id) const {
  std::set<uint32_t> referenced_entry_points;
  const auto inst = FindDef(id);
  if (!inst) return referenced_entry_points;

  std::vector<const Instruction*> stack;
  stack.push_back(inst);
  while (!stack.empty()) {
    const auto current_inst = stack.back();
    stack.pop_back();

    if (const auto func = current_inst->function()) {
      // Instruction lives in a function, we can stop searching.
      const auto function_entry_points = FunctionEntryPoints(func->id());
      referenced_entry_points.insert(function_entry_points.begin(),
                                     function_entry_points.end());
    } else {
      // Instruction is in the global scope, keep searching its uses.
      for (auto pair : current_inst->uses()) {
        const auto next_inst = pair.first;
        stack.push_back(next_inst);
      }
    }
  }

  return referenced_entry_points;
}